

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmeans.c
# Opt level: O2

float64 k_means(vector_t *mean,uint32 n_mean,uint32 n_obs,uint32 veclen,float32 min_conv_ratio,
               uint32 max_iter,codew_t **out_label)

{
  int iVar1;
  codew_t *label;
  uint uVar2;
  float64 fVar3;
  float fVar4;
  float fVar5;
  
  label = (codew_t *)
          __ckd_calloc__((ulong)n_obs,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kmeans.c"
                         ,0x5d);
  fVar3 = k_means_label(label,mean,n_mean,n_obs,veclen);
  uVar2 = 0;
  fVar4 = (3.4e+38 - (float)(double)fVar3) / 3.4e+38;
  fVar5 = (float)(double)fVar3;
  while ((uVar2 < max_iter && ((float)min_conv_ratio < fVar4))) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kmeans.c"
            ,100,"kmtrineq iter [%u] %e ...\n",(double)fVar4,(ulong)uVar2);
    iVar1 = k_means_update(mean,n_mean,veclen,label,n_obs);
    if (iVar1 != 0) {
      return -1.0;
    }
    fVar3 = k_means_label(label,mean,n_mean,n_obs,veclen);
    uVar2 = uVar2 + 1;
    fVar4 = (fVar5 - (float)(double)fVar3) / fVar5;
    fVar5 = (float)(double)fVar3;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kmeans.c"
          ,0x6f,"km n_iter %u sqerr %e conv_ratio %e\n",(double)fVar5,(double)fVar4,(ulong)uVar2);
  if (out_label == (codew_t **)0x0) {
    ckd_free(label);
  }
  else {
    *out_label = label;
  }
  return (float64)(double)fVar5;
}

Assistant:

float64
k_means(vector_t *mean,			/* initial set of means */
	uint32 n_mean,			/* # of means (should be k_mean?) */
	uint32 n_obs,			/* # of observations */
	uint32 veclen,			/* vector length of means and corpus */
	float32 min_conv_ratio,
	uint32 max_iter,		/* If not converged by this count, just quit */
	codew_t **out_label)		/* The final labelling of the corpus according
					   to the adjusted means; if NULL passed, just
					   discarded. */
{
    uint32 i;
    float32 p_sqerr = MAX_POS_FLOAT32;
    float32 sqerr;
    float32 conv_ratio;
    codew_t *label;
    int ret;

    label = (codew_t *)ckd_calloc(n_obs, sizeof(codew_t));

    sqerr = k_means_label(label, mean, n_mean, n_obs, veclen);

    conv_ratio = (p_sqerr - sqerr) / p_sqerr;

    for (i = 0; (i < max_iter) && (conv_ratio > min_conv_ratio); i++) {
	E_INFO("kmtrineq iter [%u] %e ...\n", i, conv_ratio);

	ret = k_means_update(mean, n_mean, veclen, label, n_obs);
	if (ret != K_MEANS_SUCCESS)
	    return (float64)ret;

	p_sqerr = sqerr;
	sqerr = k_means_label(label, mean, n_mean, n_obs, veclen);

	conv_ratio = (p_sqerr - sqerr) / p_sqerr;
    }
    E_INFO("km n_iter %u sqerr %e conv_ratio %e\n", i, sqerr, conv_ratio);

    if (out_label) {
	*out_label = label;
    }
    else {
	ckd_free(label);
    }

    return sqerr;
}